

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O1

bool __thiscall glslang::HlslGrammar::acceptCompilationUnit(HlslGrammar *this)

{
  TIntermNode *pTVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  TIntermAggregate *pTVar4;
  bool bVar5;
  
  bVar2 = acceptDeclarationList(this,&this->unitNode);
  bVar5 = false;
  if (bVar2) {
    bVar2 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokNone);
    bVar5 = false;
    if (bVar2) {
      pTVar1 = this->unitNode;
      if (pTVar1 != (TIntermNode *)0x0) {
        iVar3 = (*pTVar1->_vptr_TIntermNode[6])();
        if (CONCAT44(extraout_var,iVar3) == 0) {
          pTVar4 = TIntermediate::growAggregate
                             (this->intermediate,(TIntermNode *)0x0,this->unitNode);
          this->unitNode = (TIntermNode *)pTVar4;
        }
      }
      this->intermediate->treeRoot = this->unitNode;
      bVar5 = true;
    }
  }
  return bVar5;
}

Assistant:

bool HlslGrammar::acceptCompilationUnit()
{
    if (! acceptDeclarationList(unitNode))
        return false;

    if (! peekTokenClass(EHTokNone))
        return false;

    // set root of AST
    if (unitNode && !unitNode->getAsAggregate())
        unitNode = intermediate.growAggregate(nullptr, unitNode);
    intermediate.setTreeRoot(unitNode);

    return true;
}